

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O1

void absl::lts_20240722::flags_internal::FlagHelp
               (ostream *out,CommandLineFlag *flag,HelpFormat format)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string dflt_val;
  string curr_val;
  FlagHelpPrettyPrinter printer;
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  long *local_110;
  char *local_108;
  long local_100 [2];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  FlagHelpPrettyPrinter local_60;
  
  if (format == kHumanReadable) {
    local_60.max_line_len_ = 0x50;
    local_60.min_line_len_ = 4;
    local_60.wrapped_line_indent_ = 2;
    local_60.line_len_ = 0;
    local_60.first_line_ = true;
    local_c0.piece_._M_len = 2;
    local_c0.piece_._M_str = "--";
    local_60.out_ = out;
    local_90.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_f0,&local_c0);
    str._M_str = (char *)local_f0.piece_._M_len;
    str._M_len = (size_t)local_f0.piece_._M_str;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&local_60,str,false);
    if ((char *)local_f0.piece_._M_len != local_f0.digits_) {
      operator_delete((void *)local_f0.piece_._M_len,local_f0.digits_._0_8_ + 1);
    }
    local_c0.piece_._M_len = 1;
    local_c0.piece_._M_str = "(";
    (**(code **)(*(long *)flag + 0x10))(&local_110,flag);
    local_90.piece_._M_len = (size_t)local_108;
    local_90.piece_._M_str = (char *)local_110;
    local_f0.piece_._M_len = 2;
    local_f0.piece_._M_str = ");";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_130,&local_c0,&local_90);
    str_00._M_str = (char *)local_130._0_8_;
    str_00._M_len = local_130._8_8_;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&local_60,str_00,true);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    (**(code **)(*(long *)flag + 0x20))(local_130,flag);
    (**(code **)(*(long *)flag + 0x28))(&local_110,flag);
    bVar4 = true;
    if (local_108 == (char *)local_130._8_8_) {
      if (local_108 == (char *)0x0) {
        bVar4 = false;
      }
      else {
        iVar1 = bcmp(local_110,(void *)local_130._0_8_,(size_t)local_108);
        bVar4 = iVar1 != 0;
      }
    }
    pcVar2 = (char *)(**(code **)(*(long *)flag + 0x38))(flag);
    if (pcVar2 == "") {
      local_c0.piece_._M_len = 1;
      local_c0.piece_._M_str = "\"";
      local_90.piece_._M_len = local_130._8_8_;
      local_90.piece_._M_str = (char *)local_130._0_8_;
      local_f0.piece_._M_len = 1;
      local_f0.piece_._M_str = "\"";
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_150,&local_c0,&local_90);
      std::__cxx11::string::operator=((string *)local_130,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
    }
    local_c0.piece_._M_len = 9;
    local_c0.piece_._M_str = "default: ";
    local_90.piece_._M_len = local_130._8_8_;
    local_90.piece_._M_str = (char *)local_130._0_8_;
    local_f0.piece_._M_len = 1;
    local_f0.piece_._M_str = ";";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_150,&local_c0,&local_90);
    str_01._M_str = (char *)local_150._0_8_;
    str_01._M_len = local_150._8_8_;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&local_60,str_01,false);
    pcVar2 = local_150 + 0x10;
    if ((char *)local_150._0_8_ != pcVar2) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if (bVar4) {
      pcVar3 = (char *)(**(code **)(*(long *)flag + 0x38))(flag);
      if (pcVar3 == "") {
        local_c0.piece_._M_len = 1;
        local_c0.piece_._M_str = "\"";
        local_90.piece_._M_len = (size_t)local_108;
        local_90.piece_._M_str = (char *)local_110;
        local_f0.piece_._M_len = 1;
        local_f0.piece_._M_str = "\"";
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_150,&local_c0,&local_90);
        std::__cxx11::string::operator=((string *)&local_110,(string *)local_150);
        if ((char *)local_150._0_8_ != pcVar2) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
      }
      local_c0.piece_._M_len = 0xb;
      local_c0.piece_._M_str = "currently: ";
      local_90.piece_._M_len = (size_t)local_108;
      local_90.piece_._M_str = (char *)local_110;
      local_f0.piece_._M_len = 1;
      local_f0.piece_._M_str = ";";
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_150,&local_c0,&local_90);
      str_02._M_str = (char *)local_150._0_8_;
      str_02._M_len = local_150._8_8_;
      anon_unknown_0::FlagHelpPrettyPrinter::Write(&local_60,str_02,false);
      if ((char *)local_150._0_8_ != pcVar2) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
    }
    local_c0.piece_._M_len = CONCAT71(local_c0.piece_._M_len._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(local_60.out_,(char *)&local_c0,1);
    local_60.line_len_ = 0;
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void FlagHelp(std::ostream& out, const CommandLineFlag& flag,
              HelpFormat format) {
  if (format == HelpFormat::kHumanReadable)
    flags_internal::FlagHelpHumanReadable(flag, out);
}